

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::ContainerPrinter::PrintValue<std::vector<bool,std::allocator<bool>>,void>
               (vector<bool,_std::allocator<bool>_> *container,ostream *os)

{
  bool bVar1;
  const_iterator cVar2;
  bool local_79;
  bool *local_78;
  const_reference *elem;
  uint local_68;
  undefined1 local_60 [8];
  const_iterator __end0;
  undefined1 local_40 [8];
  const_iterator __begin0;
  vector<bool,_std::allocator<bool>_> *__range3;
  size_t count;
  size_t kMaxCount;
  ostream *os_local;
  vector<bool,_std::allocator<bool>_> *container_local;
  
  std::operator<<(os,'{');
  __range3 = (vector<bool,_std::allocator<bool>_> *)0x0;
  __begin0.super__Bit_iterator_base._8_8_ = container;
  cVar2 = std::vector<bool,_std::allocator<bool>_>::begin(container);
  __end0.super__Bit_iterator_base._8_8_ = cVar2.super__Bit_iterator_base._M_p;
  __begin0.super__Bit_iterator_base._M_p._0_4_ = cVar2.super__Bit_iterator_base._M_offset;
  local_40 = (undefined1  [8])__end0.super__Bit_iterator_base._8_8_;
  cVar2 = std::vector<bool,_std::allocator<bool>_>::end
                    ((vector<bool,_std::allocator<bool>_> *)__begin0.super__Bit_iterator_base._8_8_)
  ;
  elem = (const_reference *)cVar2.super__Bit_iterator_base._M_p;
  local_68 = cVar2.super__Bit_iterator_base._M_offset;
  local_60 = (undefined1  [8])elem;
  __end0.super__Bit_iterator_base._M_p._0_4_ = local_68;
  do {
    bVar1 = std::operator!=((_Bit_iterator_base *)local_40,(_Bit_iterator_base *)local_60);
    if (!bVar1) {
LAB_0030bb63:
      if (__range3 != (vector<bool,_std::allocator<bool>_> *)0x0) {
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    local_79 = std::_Bit_const_iterator::operator*((_Bit_const_iterator *)local_40);
    local_78 = &local_79;
    if ((__range3 != (vector<bool,_std::allocator<bool>_> *)0x0) &&
       (std::operator<<(os,','), __range3 == (vector<bool,_std::allocator<bool>_> *)0x20)) {
      std::operator<<(os," ...");
      goto LAB_0030bb63;
    }
    std::operator<<(os,' ');
    UniversalPrint<bool>(local_78,os);
    __range3 = (vector<bool,_std::allocator<bool>_> *)
               ((long)&(__range3->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 1);
    std::_Bit_const_iterator::operator++((_Bit_const_iterator *)local_40);
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }